

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::Statistics::Statistics(Statistics *this,TYPE ttype)

{
  Timer *pTVar1;
  
  this->timerType = ttype;
  pTVar1 = TimerFactory::createTimer(ttype);
  this->readingTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->solvingTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->preprocessingTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->simplexTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->syncTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->transformTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->rationalTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->initialPrecisionTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->extendedPrecisionTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->reconstructionTime = pTVar1;
  pTVar1 = TimerFactory::createTimer(this->timerType);
  this->boostingStepTime = pTVar1;
  (*this->readingTime->_vptr_Timer[2])();
  clearSolvingData(this);
  return;
}

Assistant:

SoPlexBase<R>::Statistics::Statistics(Timer::TYPE ttype)
{
   timerType = ttype;
   readingTime = TimerFactory::createTimer(timerType);
   solvingTime = TimerFactory::createTimer(timerType);
   preprocessingTime = TimerFactory::createTimer(timerType);
   simplexTime = TimerFactory::createTimer(timerType);
   syncTime = TimerFactory::createTimer(timerType);
   transformTime = TimerFactory::createTimer(timerType);
   rationalTime = TimerFactory::createTimer(timerType);
   initialPrecisionTime = TimerFactory::createTimer(timerType);
   extendedPrecisionTime = TimerFactory::createTimer(timerType);
   reconstructionTime = TimerFactory::createTimer(timerType);
   boostingStepTime = TimerFactory::createTimer(timerType);
   clearAllData();
}